

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void Excel::Parser::loadBook(istream *fileStream,IStorage *storage,string *fileName)

{
  bool bVar1;
  allocator local_342;
  allocator local_341;
  Stream *local_340;
  wstring local_338;
  vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> boundSheets;
  wstring local_2d8;
  File file;
  
  CompoundFile::File::File(&file,fileStream,fileName);
  std::__cxx11::wstring::wstring((wstring *)&local_2d8,L"Workbook",&local_341);
  bVar1 = CompoundFile::File::hasDirectory(&file,&local_2d8);
  if (bVar1) {
    std::__cxx11::wstring::wstring((wstring *)&local_338,L"Workbook",&local_342);
    CompoundFile::File::directory((Directory *)&boundSheets,&file,&local_338);
  }
  else {
    std::__cxx11::wstring::wstring((wstring *)&local_338,L"Book",&local_342);
    CompoundFile::File::directory((Directory *)&boundSheets,&file,&local_338);
  }
  CompoundFile::File::stream((File *)&local_340,(Directory *)&file);
  std::__cxx11::wstring::~wstring((wstring *)&boundSheets);
  std::__cxx11::wstring::~wstring((wstring *)&local_338);
  std::__cxx11::wstring::~wstring((wstring *)&local_2d8);
  boundSheets.super__Vector_base<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  boundSheets.super__Vector_base<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  boundSheets.super__Vector_base<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loadGlobals(&boundSheets,local_340,storage);
  loadWorkSheets(&boundSheets,local_340,storage);
  std::vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>::~vector(&boundSheets);
  if (local_340 != (Stream *)0x0) {
    (*local_340->_vptr_Stream[1])();
  }
  CompoundFile::File::~File(&file);
  return;
}

Assistant:

inline void
Parser::loadBook( std::istream & fileStream, IStorage & storage,
	const std::string & fileName )
{
	static_assert( sizeof( double ) == 8,
		"Unsupported platform: double has to be 8 bytes." );

	try {
		CompoundFile::File file( fileStream, fileName );
		auto stream = file.stream( 
			file.hasDirectory( L"Workbook" ) ? file.directory( L"Workbook" ) 
			                                 : file.directory( L"Book") );

		std::vector< BoundSheet > boundSheets;

		loadGlobals( boundSheets, *stream, storage );

		loadWorkSheets( boundSheets, *stream, storage );
	}
	catch( const CompoundFile::Exception & x )
	{
		throw Exception( x.whatAsWString() );
	}
}